

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O0

void __thiscall Assimp::Q3BSPFileParser::getLightMaps(Q3BSPFileParser *this)

{
  reference ppsVar1;
  sQ3BSPLightmap *psVar2;
  reference __src;
  reference ppsVar3;
  sQ3BSPLightmap *pLightmap;
  size_t idx;
  size_t Offset;
  Q3BSPFileParser *this_local;
  
  if (this->m_pModel != (Q3BSPModel *)0x0) {
    ppsVar1 = std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
              ::operator[](&this->m_pModel->m_Lumps,0xe);
    idx = (size_t)(*ppsVar1)->iOffset;
    pLightmap = (sQ3BSPLightmap *)0x0;
    while( true ) {
      psVar2 = (sQ3BSPLightmap *)
               std::
               vector<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
               ::size(&this->m_pModel->m_Lightmaps);
      if (psVar2 <= pLightmap) break;
      psVar2 = (sQ3BSPLightmap *)operator_new(0xc000);
      Q3BSP::sQ3BSPLightmap::sQ3BSPLightmap(psVar2);
      __src = std::vector<char,_std::allocator<char>_>::operator[](&this->m_Data,idx);
      memcpy(psVar2,__src,0xc000);
      idx = idx + 0xc000;
      ppsVar3 = std::
                vector<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
                ::operator[](&this->m_pModel->m_Lightmaps,(size_type)pLightmap);
      *ppsVar3 = psVar2;
      pLightmap = (sQ3BSPLightmap *)(pLightmap->bLMapData + 1);
    }
    return;
  }
  __assert_fail("nullptr != m_pModel",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileParser.cpp"
                ,0xf8,"void Assimp::Q3BSPFileParser::getLightMaps()");
}

Assistant:

void Q3BSPFileParser::getLightMaps()
{
    ai_assert(nullptr != m_pModel );

    size_t Offset = m_pModel->m_Lumps[kLightmaps]->iOffset;
    for ( size_t idx=0; idx < m_pModel->m_Lightmaps.size(); idx++ )
    {
        sQ3BSPLightmap *pLightmap = new sQ3BSPLightmap;
        memcpy( pLightmap, &m_Data[ Offset ], sizeof( sQ3BSPLightmap ) );
        Offset += sizeof( sQ3BSPLightmap );
        m_pModel->m_Lightmaps[ idx ] = pLightmap;
    }
}